

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_win_unpart(ggml_context *ctx,ggml_tensor *a,int w0,int h0,int w)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  char *file;
  int64_t ne [4];
  int64_t local_38;
  long local_30;
  long local_28;
  undefined8 local_20;
  
  if (a->type == GGML_TYPE_F32) {
    local_38 = a->ne[0];
    local_30 = (long)w0;
    local_28 = (long)h0;
    local_20 = 1;
    pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,3,&local_38,(ggml_tensor *)0x0,0);
    if (pgVar1 != (ggml_tensor *)0x0) {
      pgVar1->op_params[0] = w;
      pgVar1->op = GGML_OP_WIN_UNPART;
      pgVar1->src[0] = a;
      return pgVar1;
    }
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h";
    pcVar2 = "tensor != NULL";
    line = 0x70;
  }
  else {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
    pcVar2 = "a->type == GGML_TYPE_F32";
    line = 0x1224;
  }
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_win_unpart(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   w0,
        int                   h0,
        int                   w) {
    GGML_ASSERT(a->type == GGML_TYPE_F32);

    const int64_t ne[4] = { a->ne[0], w0, h0, 1, };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 3, ne);

    int32_t params[] = { w };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_WIN_UNPART;
    result->src[0] = a;

    return result;
}